

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool __thiscall
crnlib::command_line_params::get_value_as_bool
          (command_line_params *this,char *pKey,uint index,bool def)

{
  bool bVar1;
  param_map_const_iterator this_00;
  pointer ppVar2;
  byte in_CL;
  command_line_params *in_RDI;
  char *unaff_retaddr;
  command_line_params *in_stack_00000008;
  param_map_const_iterator it;
  _Self local_28;
  byte local_1d;
  uint in_stack_fffffffffffffffc;
  
  local_1d = in_CL & 1;
  local_28._M_node = (_Base_ptr)get_param(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc)
  ;
  this_00 = end(in_RDI);
  bVar1 = std::operator==(&local_28,(_Self *)&stack0xffffffffffffffd0);
  if (bVar1) {
    bVar1 = (bool)(local_1d & 1);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                           *)this_00._M_node);
    if ((ppVar2->second).m_modifier == '\0') {
      bVar1 = true;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                             *)this_00._M_node);
      bVar1 = '\0' < (ppVar2->second).m_modifier;
    }
  }
  return bVar1;
}

Assistant:

bool command_line_params::get_value_as_bool(const char* pKey, uint index, bool def) const {
  param_map_const_iterator it = get_param(pKey, index);
  if (it == end())
    return def;

  if (it->second.m_modifier)
    return it->second.m_modifier > 0;
  else
    return true;
}